

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.2.4.11.h
# Opt level: O2

bool doctest::operator>(Approx *lhs,double rhs)

{
  bool bVar1;
  
  if (lhs->m_value <= rhs) {
    return false;
  }
  bVar1 = operator==(rhs,lhs);
  return !bVar1;
}

Assistant:

bool operator>(const Approx& lhs, double rhs) { return lhs.m_value > rhs && lhs != rhs; }